

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O2

I32 laszip_prepare_header_for_write(laszip_dll_struct *laszip_dll)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  I32 IVar4;
  uint uVar5;
  long lVar6;
  
  bVar1 = (laszip_dll->header).version_minor;
  if (bVar1 < 5 && (laszip_dll->header).version_major == '\x01') {
    if (5 < (laszip_dll->header).point_data_format) {
      (laszip_dll->header).number_of_point_records = 0;
      for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
        (laszip_dll->header).number_of_points_by_return[lVar6] = 0;
      }
      return 0;
    }
    IVar4 = 0;
    if (bVar1 != 4) {
      return 0;
    }
    uVar2 = (laszip_dll->header).number_of_point_records;
    uVar3 = (laszip_dll->header).extended_number_of_point_records;
    if (uVar3 != uVar2) {
      if (uVar2 != 0) {
        snprintf(laszip_dll->error,0x400,
                 "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu"
                );
        goto LAB_00143ad3;
      }
      if (uVar3 >> 0x20 == 0) {
        (laszip_dll->header).number_of_point_records = (laszip_U32)uVar3;
      }
    }
    for (lVar6 = 0x1b; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      uVar2 = *(uint *)((laszip_dll->header).project_ID_GUID_data_4 + lVar6 * 4 + -0xc);
      uVar3 = *(ulong *)((laszip_dll->header).generating_software + lVar6 * 8 + -0xe);
      if (uVar3 != uVar2) {
        if (uVar2 != 0) {
          uVar5 = (int)lVar6 - 0x1b;
          snprintf(laszip_dll->error,0x400,
                   "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu"
                   ,(ulong)uVar5,(ulong)uVar2,(ulong)uVar5,uVar3);
          goto LAB_00143ad3;
        }
        if (uVar3 >> 0x20 == 0) {
          *(int *)((laszip_dll->header).project_ID_GUID_data_4 + lVar6 * 4 + -0xc) = (int)uVar3;
        }
      }
    }
  }
  else {
    snprintf(laszip_dll->error,0x400,"unknown LAS version %d.%d");
LAB_00143ad3:
    IVar4 = 1;
  }
  return IVar4;
}

Assistant:

static I32
laszip_prepare_header_for_write(
    laszip_dll_struct*                 laszip_dll
)
{
  if ((laszip_dll->header.version_major != 1) || (laszip_dll->header.version_minor > 4))
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "unknown LAS version %d.%d", (I32)laszip_dll->header.version_major, (I32)laszip_dll->header.version_minor);
    return 1;
  }

  // check counters
  U32 i;

  if (laszip_dll->header.point_data_format > 5)
  {
    // legacy counters are zero for new point types

    laszip_dll->header.number_of_point_records = 0;
    for (i = 0; i < 5; i++)
    {
      laszip_dll->header.number_of_points_by_return[i] = 0;
    }
  }
  else if (laszip_dll->header.version_minor > 3)
  {
    // legacy counters must be zero or consistent for old point types

    if (laszip_dll->header.number_of_point_records != laszip_dll->header.extended_number_of_point_records)
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wformat"
#endif
      if (laszip_dll->header.number_of_point_records != 0)
      {
        snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu", laszip_dll->header.number_of_point_records, laszip_dll->header.extended_number_of_point_records);
        return 1;
      }     
      else if (laszip_dll->header.extended_number_of_point_records <= U32_MAX)
      {
        laszip_dll->header.number_of_point_records = (U32)laszip_dll->header.extended_number_of_point_records;
      }
    }
    for (i = 0; i < 5; i++)
    {
      if (laszip_dll->header.number_of_points_by_return[i] != laszip_dll->header.extended_number_of_points_by_return[i])
      {
        if (laszip_dll->header.number_of_points_by_return[i] != 0)
        {
          snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu", i, laszip_dll->header.number_of_points_by_return[i], i, laszip_dll->header.extended_number_of_points_by_return[i]);
          return 1;
        }   
        else if (laszip_dll->header.extended_number_of_points_by_return[i] <= U32_MAX)
        {
          laszip_dll->header.number_of_points_by_return[i] = (U32)laszip_dll->header.extended_number_of_points_by_return[i];
        }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }
    }
  }

  return 0;
}